

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_ref(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  uv_idle_t uStack_88;
  uv_loop_t *puStack_10;
  
  puStack_10 = (uv_loop_t *)0x1667a6;
  puVar2 = uv_default_loop();
  puStack_10 = (uv_loop_t *)0x1667b0;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_10 = (uv_loop_t *)0x1667b5;
  puVar2 = uv_default_loop();
  puStack_10 = (uv_loop_t *)0x1667c9;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_10 = (uv_loop_t *)0x1667d3;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_10 = (uv_loop_t *)0x1667d8;
  loop = uv_default_loop();
  puStack_10 = (uv_loop_t *)0x1667e0;
  iVar1 = uv_loop_close(loop);
  if (iVar1 == 0) {
    return 0;
  }
  puStack_10 = (uv_loop_t *)run_test_idle_ref;
  run_test_ref_cold_1();
  puStack_10 = puVar2;
  puVar2 = uv_default_loop();
  uv_idle_init(puVar2,&uStack_88);
  uv_idle_start(&uStack_88,fail_cb2);
  uv_unref((uv_handle_t *)&uStack_88);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  do_close(&uStack_88);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_idle_ref_cold_1();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x3e,"0 && \"fail_cb2 should not have been called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(ref) {
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  MAKE_VALGRIND_HAPPY();
  return 0;
}